

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_set_header2(http_s *r,fio_str_info_s n,fio_str_info_s v)

{
  int iVar1;
  FIOBJ name;
  FIOBJ value;
  
  if (r != (http_s *)0x0) {
    if ((r->method == 0) && (r->status_str == 0)) {
      if (r->status != 0 || n.data == (char *)0x0) {
        return -1;
      }
    }
    else if (n.data == (char *)0x0) {
      return -1;
    }
    if ((n.len != 0) && (v.len != 0 || v.data == (char *)0x0)) {
      name = fiobj_str_new(n.data,n.len);
      value = fiobj_str_new(v.data,v.len);
      iVar1 = http_set_header(r,name,value);
      fiobj_free(name);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int http_set_header2(http_s *r, fio_str_info_s n, fio_str_info_s v) {
  if (HTTP_INVALID_HANDLE(r) || !n.data || !n.len || (v.data && !v.len))
    return -1;
  FIOBJ tmp = fiobj_str_new(n.data, n.len);
  int ret = http_set_header(r, tmp, fiobj_str_new(v.data, v.len));
  fiobj_free(tmp);
  return ret;
}